

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestMessageSetLite::_InternalSerialize
          (TestMessageSetLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestMessageSetLite *extendee;
  uint8_t *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown_fields;
  TestMessageSetLite *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestMessageSetLite *this_local;
  
  extendee = default_instance();
  puVar1 = google::protobuf::internal::ExtensionSet::
           InternalSerializeMessageSetWithCachedSizesToArray
                     (&(this->field_0)._impl_._extensions_,&extendee->super_MessageLite,target,
                      stream);
  unknown_fields =
       google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
                 (&(this->super_MessageLite)._internal_metadata_,
                  google::protobuf::internal::GetEmptyString_abi_cxx11_);
  puVar1 = google::protobuf::internal::InternalSerializeUnknownMessageSetItemsToArray
                     (unknown_fields,puVar1,stream);
  return puVar1;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMessageSetLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMessageSetLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
   target =
      this_._impl_._extensions_
          .InternalSerializeMessageSetWithCachedSizesToArray(
              &default_instance(), target, stream);
  target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(
      this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString), target, stream);
  return target;
}